

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ClosureTest_TestPermanentClosureMethod0_Test::
ClosureTest_TestPermanentClosureMethod0_Test(ClosureTest_TestPermanentClosureMethod0_Test *this)

{
  ClosureTest_TestPermanentClosureMethod0_Test *this_local;
  
  ClosureTest::ClosureTest(&this->super_ClosureTest);
  (this->super_ClosureTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ClosureTest_TestPermanentClosureMethod0_Test_02a29ec0;
  return;
}

Assistant:

TEST_F(ClosureTest, TestPermanentClosureMethod0) {
  Closure* closure = NewPermanentCallback(current_instance_,
                                          &ClosureTest::SetA123Method);
  EXPECT_NE(123, a_);
  closure->Run();
  EXPECT_EQ(123, a_);
  a_ = 0;
  closure->Run();
  EXPECT_EQ(123, a_);
  delete closure;
}